

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MolecularRestraint.hpp
# Opt level: O2

void __thiscall OpenMD::MolecularRestraint::~MolecularRestraint(MolecularRestraint *this)

{
  ~MolecularRestraint(this);
  operator_delete(this,0x100);
  return;
}

Assistant:

MolecularRestraint() : Restraint() {}